

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_info.hpp
# Opt level: O2

value * lightconf::value_type_info<std::vector<person,_std::allocator<person>_>_>::create_value
                  (value *__return_storage_ptr__,vector<person,_std::allocator<person>_> *x)

{
  pointer ppVar1;
  pointer x_00;
  value_vector_type inner_vals;
  vector<lightconf::value,_std::allocator<lightconf::value>_> local_d8;
  value local_c0;
  
  local_d8.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar1 = (x->super__Vector_base<person,_std::allocator<person>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (x_00 = (x->super__Vector_base<person,_std::allocator<person>_>)._M_impl.
              super__Vector_impl_data._M_start; x_00 != ppVar1; x_00 = x_00 + 1) {
    value_type_info<person>::create_value(&local_c0,x_00);
    std::vector<lightconf::value,_std::allocator<lightconf::value>_>::emplace_back<lightconf::value>
              (&local_d8,&local_c0);
    value::~value(&local_c0);
  }
  value::value(__return_storage_ptr__,&local_d8);
  std::vector<lightconf::value,_std::allocator<lightconf::value>_>::~vector(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

static value create_value(const std::vector<U>& x) {
        value_vector_type inner_vals;
        for (const auto& u : x) {
            inner_vals.push_back(value_type_info<U>::create_value(u));
        }
        return value(inner_vals);
    }